

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O0

uint glTF2::ComponentTypeSize(ComponentType t)

{
  DeadlyImportError *this;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  ComponentType local_10;
  uint local_c;
  ComponentType t_local;
  
  if (t - ComponentType_BYTE < 2) {
    local_c = 1;
  }
  else if (t - ComponentType_SHORT < 2) {
    local_c = 2;
  }
  else {
    if (1 < t - ComponentType_UNSIGNED_INT) {
      local_10 = t;
      this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      to_string<glTF2::ComponentType>(&local_50,local_10);
      std::operator+(&local_30,"GLTF: Unsupported Component Type ",&local_50);
      DeadlyImportError::DeadlyImportError(this,&local_30);
      __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    local_c = 4;
  }
  return local_c;
}

Assistant:

inline
    unsigned int ComponentTypeSize(ComponentType t)
    {
        switch (t) {
            case ComponentType_SHORT:
            case ComponentType_UNSIGNED_SHORT:
                return 2;

            case ComponentType_UNSIGNED_INT:
            case ComponentType_FLOAT:
                return 4;

            case ComponentType_BYTE:
            case ComponentType_UNSIGNED_BYTE:
                return 1;
            default:
                throw DeadlyImportError("GLTF: Unsupported Component Type " + to_string(t));
        }
    }